

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitB(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  
  iVar2 = this->v;
  iVar3 = this->vw;
  iVar4 = this->u;
  if (-iVar2 < iVar3) {
    bVar1 = (this->res).vlog2;
    iVar3 = this->uw;
    pfVar7 = this->ku;
    pfVar8 = this->kv;
    k->res = this->res;
    k->u = iVar4;
    k->v = (1 << (bVar1 & 0x1f)) + iVar2;
    k->uw = iVar3;
    k->vw = -iVar2;
    memcpy(k->kubuff,pfVar7,(long)iVar3 << 2);
    memcpy(k->kvbuff,pfVar8,(long)iVar2 * -4);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    this->v = 0;
    this->vw = this->vw + iVar2;
    this->kv = this->kv + -(long)iVar2;
  }
  else {
    iVar5 = this->uw;
    pfVar7 = this->ku;
    pfVar8 = this->kv;
    iVar6 = this->rot;
    k->res = this->res;
    k->u = iVar4;
    k->v = iVar2;
    k->uw = iVar5;
    k->vw = iVar3;
    memcpy(k->kubuff,pfVar7,(long)iVar5 << 2);
    memcpy(k->kvbuff,pfVar8,(long)iVar3 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = iVar6;
    k->v = (1 << ((this->res).vlog2 & 0x1fU)) + iVar2;
    this->v = 0;
    this->vw = 0;
  }
  return;
}

Assistant:

void splitB(PtexSeparableKernel& k)
    {
        // split off bottom piece of width w into k
        int w = -v;
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v          uw vw  ku  kv
            k.set(res, u, res.v()-w, uw, w, ku, kv);

            // update local
            v = 0;
            vw -= w;
            kv += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v += res.v();
            v = 0; vw = 0;
        }
    }